

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void Save_Trainer(char *filename,bool save_with_examples)

{
  Am_String *pAVar1;
  Am_Value_List *pAVar2;
  undefined7 in_register_00000031;
  Am_Gesture_Classifier cl;
  ofstream out;
  Am_String local_240;
  Am_String local_238;
  Am_String local_230 [2];
  Am_Value_List local_220 [16];
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,filename,_S_out);
  if ((int)CONCAT71(in_register_00000031,save_with_examples) == 0) {
    Am_Gesture_Trainer::Train();
    operator<<((ostream *)&local_210,(Am_Gesture_Classifier *)local_230);
    Am_Gesture_Classifier::~Am_Gesture_Classifier((Am_Gesture_Classifier *)local_230);
  }
  else {
    operator<<((ostream *)&local_210,(Am_Gesture_Trainer *)&trainer);
  }
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 5) != 0) {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_230);
    Am_String::Am_String(&local_238,filename,true);
    pAVar1 = (Am_String *)Am_Value_List::Add(local_230,(Am_Add_Position)&local_238,true);
    Am_String::Am_String(&local_240,"can\'t be written.",true);
    pAVar2 = (Am_Value_List *)Am_Value_List::Add(pAVar1,(Am_Add_Position)&local_240,true);
    Am_Value_List::Am_Value_List(local_220,pAVar2);
    Popup_Error(local_220);
    Am_Value_List::~Am_Value_List(local_220);
    Am_String::~Am_String(&local_240);
    Am_String::~Am_String(&local_238);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_230);
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _TypeError;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void
Save_Trainer(char *filename, bool save_with_examples)
{
  ofstream out(filename);

  if (save_with_examples)
    out << trainer;
  else {
    Am_Gesture_Classifier cl = trainer.Train();
    out << cl;
  }

  if (!out)
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("can't be written.")));
}